

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modeq.cpp
# Opt level: O2

ll solve_modeq(ll a,ll b,ll m)

{
  long lVar1;
  long lVar2;
  ll lVar3;
  pair<long_long,_long_long> pVar4;
  
  lVar1 = a % m;
  lVar3 = m;
  while (lVar3 != 0) {
    lVar2 = lVar1 % lVar3;
    lVar1 = lVar3;
    lVar3 = lVar2;
  }
  if ((b % m) % lVar1 == 0) {
    pVar4 = extgcd(a % m,m);
    lVar3 = ((pVar4.first * ((b % m) / lVar1)) % m + m) % m;
  }
  else {
    lVar3 = -1;
  }
  return lVar3;
}

Assistant:

ll solve_modeq(ll a, ll b, ll m) {
	// We have a * k + m * y = b for unknown k and y
	a %= m, b %= m;
	ll g = gcd(a, m);
	if (b % g)
		return -1;

	ll t = b / g;
	ll k = extgcd(a, m).first * t;
	return (k % m + m) % m;
}